

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

bool __thiscall
rengine::OpenGLRenderer::readPixels(OpenGLRenderer *this,int x,int y,int w,int h,uint *bytes)

{
  int local_2c;
  int i;
  uint *bytes_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  OpenGLRenderer *this_local;
  
  for (local_2c = 0; local_2c < h; local_2c = local_2c + 1) {
    glReadPixels(x,((y + h) - local_2c) + -1,w,1,0x1908,0x1401,bytes + local_2c * w);
  }
  return true;
}

Assistant:

inline bool OpenGLRenderer::readPixels(int x, int y, int w, int h, unsigned *bytes)
{
    // Read line-by-line and flip it so we get what we want out..
    // Slow as hell, but this is used for autotesting, so who cares..
    for (int i=0; i<h; ++i)
        glReadPixels(x, y + h - i - 1, w, 1, GL_RGBA, GL_UNSIGNED_BYTE, bytes + i * w);
    return true;
}